

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeSignature(ucvector *out)

{
  ucvector *in_RDI;
  
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  ucvector_push_back(in_RDI,'\0');
  return;
}

Assistant:

static void writeSignature(ucvector* out) {
  /*8 bytes PNG signature, aka the magic bytes*/
  ucvector_push_back(out, 137);
  ucvector_push_back(out, 80);
  ucvector_push_back(out, 78);
  ucvector_push_back(out, 71);
  ucvector_push_back(out, 13);
  ucvector_push_back(out, 10);
  ucvector_push_back(out, 26);
  ucvector_push_back(out, 10);
}